

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Expr * __thiscall kratos::Var::r_xor(Var *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Expr *pEVar2;
  undefined1 local_20 [8];
  shared_ptr<kratos::Var> var;
  
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  Generator::get_var((Generator *)local_20,(string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  pEVar2 = Generator::expr((Generator *)CONCAT44(extraout_var_00,iVar1),UXor,this,(Var *)0x0);
  if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pEVar2;
}

Assistant:

Expr &Var::r_xor() const {
    auto var = generator()->get_var(name);
    return generator()->expr(ExprOp::UXor, const_cast<Var *>(this), nullptr);
}